

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O0

void findAndMarkSuccessor(args *t,stateRecord *state)

{
  node *node_00;
  node *parent;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __int_type _Var4;
  __pointer_type pnVar5;
  node *pnVar6;
  node *pnVar7;
  node *left;
  node *temp;
  bool result;
  bool p;
  bool d;
  bool n;
  bool m;
  edge successorEdge;
  seekRecord *s;
  node *node;
  stateRecord *state_local;
  args *t_local;
  
  node_00 = (state->targetEdge).child;
  do {
    while( true ) {
      do {
        _Var4 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)node_00);
        bVar1 = KeyMarked(_Var4);
        findSmallest(t,node_00,&state->successorRecord);
        if (bVar1) goto LAB_0010309e;
        parent = (state->successorRecord).lastEdge.child;
        pnVar5 = std::atomic::operator_cast_to_node_((atomic *)parent->child);
        bVar1 = isNull(pnVar5);
        bVar2 = PFlagSet(pnVar5);
        pnVar6 = getAddress(pnVar5);
      } while (!bVar1);
      _Var4 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)node_00);
      bVar1 = KeyMarked(_Var4);
      if (bVar1) break;
      pnVar6 = setNull(pnVar6);
      pnVar7 = setNull(node_00);
      pnVar7 = setPFlag(pnVar7);
      bVar1 = CAS(parent,0,pnVar6,pnVar7);
      if (bVar1) goto LAB_0010309e;
      pnVar5 = std::atomic::operator_cast_to_node_((atomic *)parent->child);
      bVar1 = isNull(pnVar5);
      bVar2 = DFlagSet(pnVar5);
      bVar3 = PFlagSet(pnVar5);
      if (bVar3) goto LAB_0010309e;
      if ((bVar1) && (bVar2)) {
        helpTargetNode(t,&(state->successorRecord).lastEdge,state->depth + 1);
      }
    }
  } while (!bVar2);
LAB_0010309e:
  updateMode(t,state);
  return;
}

Assistant:

void findAndMarkSuccessor(struct args* t, struct stateRecord* state)
{
    struct node* node;
    struct seekRecord* s;
    struct edge successorEdge;
    bool m,n,d,p,result;
    struct node* temp;
    struct node* left;

    node = state->targetEdge.child;
    s = &state->successorRecord;

    while(true)
    {
        m=KeyMarked(node->markedKey);
        findSmallest(t,node,s);
        if(m)
        {
            break;
        }
        successorEdge = s->lastEdge;
        temp = successorEdge.child->child[LC];
        n=isNull(temp);
        p=PFlagSet(temp);
        left=getAddress(temp);
        if(!n)
        {
            continue;
        }
        m=KeyMarked(node->markedKey);
        if(m)
        {
            if(p)
            {
                break;
            }
            else
            {
                continue;
            }
        }
        result = CAS(successorEdge.child,LC,setNull(left),setPFlag(setNull(node)));
        if(result)
        {
            break;
        }
        temp = successorEdge.child->child[LC];
        n = isNull(temp);
        d = DFlagSet(temp);
        p = PFlagSet(temp);

        if(p)
        {
            break;
        }
        if(!n)
        {
            continue;
        }
        if(d)
        {
            helpTargetNode(t,&s->lastEdge,state->depth+1);
        }
    }
    updateMode(t,state);
    return;
}